

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpy.c
# Opt level: O3

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
    char s[] = "xxxxx";
    TESTCASE( strcpy( s, "" ) == s );
    TESTCASE( s[0] == '\0' );
    TESTCASE( s[1] == 'x' );
    TESTCASE( strcpy( s, abcde ) == s );
    TESTCASE( s[0] == 'a' );
    TESTCASE( s[4] == 'e' );
    TESTCASE( s[5] == '\0' );
    return TEST_RESULTS;
}